

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O1

uint64_t __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::copy_from_right_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t slot_id)

{
  pointer puVar1;
  uint64_t uVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar6 = slot_id + 1 & (this->capa_size_).mask_;
  puVar1 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (this->table_).width_;
  uVar5 = uVar2 * uVar6;
  uVar7 = (ulong)((uint)uVar5 & 0x3f);
  uVar8 = puVar1[uVar5 >> 6];
  if (uVar2 + uVar7 < 0x41) {
    uVar8 = uVar8 >> uVar7;
  }
  else {
    bVar3 = (byte)uVar5 & 0x3f;
    uVar8 = uVar8 >> bVar3 | puVar1[(uVar5 >> 6) + 1] << 0x40 - bVar3;
  }
  uVar5 = (this->table_).mask_;
  bVar4 = get_vbit_(this,slot_id);
  compact_vector::set(&this->table_,slot_id,(uVar8 & uVar5 & 0xfffffffffffffffd) + (ulong)bVar4 * 2)
  ;
  return uVar6;
}

Assistant:

uint64_t copy_from_right_(uint64_t slot_id) {
        uint64_t _slot_id = right_(slot_id);
        table_.set(slot_id, (table_.get(_slot_id) & ~2ULL) | (get_vbit_(slot_id) << 1));
        return _slot_id;
    }